

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O2

double __thiscall ON_ShutLining::Curve::Radius(Curve *this)

{
  CImpl *this_00;
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  this_00 = this->m_impl;
  ::ON_XMLVariant::ON_XMLVariant(&local_108,1.0);
  CImpl::GetParam(&local_200,this_00,L"radius",&local_108);
  dVar1 = ::ON_XMLVariant::operator_cast_to_double(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  return dVar1;
}

Assistant:

double ON_ShutLining::Curve::Radius(void) const
{
  return m_impl->GetParam(ON_SHUTLINING_CURVE_RADIUS, 1.0);
}